

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QHash<QString,QSqlDatabase>::key_iterator>
          (QCommonArrayOps<QString> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QString,_QSqlDatabase>::key_iterator> param_3)

{
  qsizetype *pqVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *pDVar3;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  iterator<QHashPrivate::Node<QString,_QSqlDatabase>_> local_48;
  long local_38;
  
  uVar2 = b.i.i.bucket;
  pDVar3 = b.i.i.d;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = pDVar3;
  local_48.bucket = uVar2;
  std::__distance<QHash<QString,QSqlDatabase>::key_iterator>(pDVar3,uVar2,e.i.i.d,e.i.i.bucket);
  this_00 = &(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
             [(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
              size].d;
  while (uVar2 != e.i.i.bucket || pDVar3 != e.i.i.d) {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (this_00,(QArrayDataPointer<char16_t> *)
                       (pDVar3->spans[uVar2 >> 7].entries +
                       pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]));
    pqVar1 = &(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
              size;
    *pqVar1 = *pqVar1 + 1;
    this_00 = this_00 + 1;
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QSqlDatabase>_>::operator++(&local_48);
    uVar2 = local_48.bucket;
    pDVar3 = local_48.d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }